

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::checkseg4encroach(tetgenmesh *this,point pa,point pb,point checkpt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double t;
  double v;
  double u;
  double prjpt [3];
  double local_68;
  double v2 [3];
  double local_48;
  double v1 [3];
  point checkpt_local;
  point pb_local;
  point pa_local;
  tetgenmesh *this_local;
  
  local_48 = *pa - *checkpt;
  v1[0] = pa[1] - checkpt[1];
  v1[1] = pa[2] - checkpt[2];
  local_68 = *pb - *checkpt;
  v2[0] = pb[1] - checkpt[1];
  v2[1] = pb[2] - checkpt[2];
  v1[2] = (double)checkpt;
  dVar3 = dot(this,&local_48,&local_68);
  if (dVar3 < 0.0) {
    if (this->b->metric == 0) {
      return 1;
    }
    if ((pa[this->pointmtrindex] <= 0.0) || (pb[this->pointmtrindex] <= 0.0)) {
      return 1;
    }
    projpt2edge(this,(double *)v1[2],pa,pb,&u);
    dVar4 = distance(this,pa,pb);
    dVar5 = distance(this,pa,&u);
    dVar3 = pa[this->pointmtrindex];
    dVar1 = pb[this->pointmtrindex];
    dVar2 = pa[this->pointmtrindex];
    dVar6 = distance(this,(double *)v1[2],&u);
    if (dVar6 < (dVar5 / dVar4) * (dVar1 - dVar2) + dVar3) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::checkseg4encroach(point pa, point pb, point checkpt)
{
  // Check if the point lies inside the diametrical sphere of this seg. 
  REAL v1[3], v2[3];

  v1[0] = pa[0] - checkpt[0];
  v1[1] = pa[1] - checkpt[1];
  v1[2] = pa[2] - checkpt[2];
  v2[0] = pb[0] - checkpt[0];
  v2[1] = pb[1] - checkpt[1];
  v2[2] = pb[2] - checkpt[2];

  if (dot(v1, v2) < 0) {
    // Inside.
    if (b->metric) { // -m option.
      if ((pa[pointmtrindex] > 0) && (pb[pointmtrindex] > 0)) {
        // The projection of 'checkpt' lies inside the segment [a,b].
        REAL prjpt[3], u, v, t;
        projpt2edge(checkpt, pa, pb, prjpt);
        // Interoplate the mesh size at the location 'prjpt'.
        u = distance(pa, pb);
        v = distance(pa, prjpt);
        t = v / u;
        // 'u' is the mesh size at 'prjpt'
        u = pa[pointmtrindex] + t * (pb[pointmtrindex] - pa[pointmtrindex]);
        v = distance(checkpt, prjpt);
        if (v < u) {
          return 1; // Encroached prot-ball!
        }
      } else {
        return 1; // NO protecting ball. Encroached.
      }
    } else {
      return 1; // Inside! Encroached.
    }
  }

  return 0;
}